

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::(anonymous_namespace)::SymbolByFullNameEq::operator()
          (void *this,Symbol *a,Symbol *b)

{
  bool bVar1;
  int iVar2;
  size_t __n;
  size_type __rlen;
  string_view sVar3;
  string_view sVar4;
  
  sVar3 = Symbol::full_name((Symbol *)this);
  __n = sVar3._M_len;
  sVar4 = Symbol::full_name(a);
  if (__n == sVar4._M_len) {
    if (__n != 0) {
      iVar2 = bcmp(sVar3._M_str,sVar4._M_str,__n);
      if (iVar2 != 0) goto LAB_003ad1b7;
    }
    bVar1 = true;
  }
  else {
LAB_003ad1b7:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool operator()(const T& a, const U& b) const {
    return a.full_name() == b.full_name();
  }